

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_lex.c
# Opt level: O2

void easm_restart(FILE *input_file,yyscan_t yyscanner)

{
  YY_BUFFER_STATE pyVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = *(long *)((long)yyscanner + 0x38);
  if ((lVar2 == 0) || (lVar3 = *(long *)((long)yyscanner + 0x28), *(long *)(lVar2 + lVar3 * 8) == 0)
     ) {
    easm_ensure_buffer_stack(yyscanner);
    pyVar1 = easm__create_buffer(*(FILE **)((long)yyscanner + 0x18),0x4000,yyscanner);
    lVar3 = *(long *)((long)yyscanner + 0x28);
    *(YY_BUFFER_STATE *)(*(long *)((long)yyscanner + 0x38) + lVar3 * 8) = pyVar1;
    lVar2 = *(long *)((long)yyscanner + 0x38);
    if (lVar2 == 0) {
      pyVar1 = (YY_BUFFER_STATE)0x0;
      goto LAB_0024c5c2;
    }
  }
  pyVar1 = *(YY_BUFFER_STATE *)(lVar2 + lVar3 * 8);
LAB_0024c5c2:
  easm__init_buffer(pyVar1,input_file,yyscanner);
  easm__load_buffer_state(yyscanner);
  return;
}

Assistant:

void yyrestart  (FILE * input_file , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack (yyscanner);
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE , yyscanner);
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file , yyscanner);
	yy_load_buffer_state( yyscanner );
}